

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

MutableStringView __thiscall
Corrade::Containers::String::trimmedSuffix(String *this,StringView characters)

{
  BasicStringView<char> BVar1;
  MutableStringView MVar2;
  BasicStringView<char> BStack_28;
  
  BasicStringView<char>::BasicStringView(&BStack_28,this);
  BVar1 = BasicStringView<char>::trimmedSuffix(&BStack_28,characters);
  MVar2._data = BVar1._data;
  MVar2._sizePlusFlags = BVar1._sizePlusFlags;
  return MVar2;
}

Assistant:

MutableStringView String::trimmedSuffix(const StringView characters) {
    return MutableStringView{*this}.trimmedSuffix(characters);
}